

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Routines_ModRM.c
# Opt level: O2

size_t printSeparator(OPTYPE *pMyOperand,size_t i,PDISASM pMyDisasm)

{
  char *pcVar1;
  long lStack_8;
  
  if ((pMyDisasm->Reserved_).SYNTAX_ == 0x400) {
    pcVar1 = pMyOperand->OpMnemonic + i;
    if ((pMyDisasm->Reserved_).BASE_ == 5) {
      builtin_strncpy(pMyOperand->OpMnemonic + i,"(,%",4);
      lStack_8 = 3;
    }
    else {
      pcVar1[2] = '\0';
      pcVar1[0] = ',';
      pcVar1[1] = '%';
      lStack_8 = 2;
    }
  }
  else {
    (pMyOperand->OpMnemonic + i)[0] = '+';
    (pMyOperand->OpMnemonic + i)[1] = '\0';
    lStack_8 = 1;
  }
  return lStack_8 + i;
}

Assistant:

size_t __bea_callspec__ printSeparator(OPTYPE* pMyOperand, size_t i, PDISASM pMyDisasm)
{
  if (GV.SYNTAX_ == ATSyntax) {
    if (GV.BASE_  == 5) {
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy((char*) pMyOperand->OpMnemonic+i, "(,%");
      #endif
      i+=3;
    }
    else {
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy((char*) pMyOperand->OpMnemonic+i, ",%");
      #endif
      i+=2;
    }
  }
  else {
    #ifndef BEA_LIGHT_DISASSEMBLY
       (void) strcpy((char*) pMyOperand->OpMnemonic+i, "+");
    #endif
    i+=1;
  }
  return i;
}